

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

Vec_Wrd_t * Gia_ManSimBitPacking(Gia_Man_t *p,Vec_Int_t *vCexStore,int nCexes,int nUnDecs)

{
  uint uVar1;
  uint uVar2;
  int nLits;
  int iVar3;
  Vec_Wrd_t *vSimsIn;
  word *__s;
  word wVar4;
  Vec_Wrd_t *vSimsCare;
  word *__s_00;
  Vec_Wrd_t *pVVar5;
  int nWords;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  
  nWords = ((nCexes >> 6) + 1) - (uint)((nCexes & 0x3fU) == 0);
  uVar7 = (long)nWords * (long)p->vCis->nSize;
  vSimsIn = (Vec_Wrd_t *)malloc(0x10);
  iVar6 = (int)uVar7;
  uVar8 = iVar6 - 1;
  iVar9 = 0x10;
  if (0xe < uVar8) {
    iVar9 = iVar6;
  }
  vSimsIn->nCap = iVar9;
  if (iVar9 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar9 << 3);
  }
  vSimsIn->pArray = __s;
  vSimsIn->nSize = iVar6;
  memset(__s,0,uVar7 * 8);
  if (0 < iVar6) {
    uVar10 = 0;
    do {
      wVar4 = Abc_RandomW(0);
      __s[uVar10] = wVar4;
      uVar10 = uVar10 + 1;
    } while ((uVar7 & 0xffffffff) != uVar10);
    uVar8 = p->vCis->nSize * nWords;
    uVar7 = (ulong)uVar8;
    uVar8 = uVar8 - 1;
  }
  vSimsCare = (Vec_Wrd_t *)malloc(0x10);
  iVar9 = (int)uVar7;
  iVar6 = 0x10;
  if (0xe < uVar8) {
    iVar6 = iVar9;
  }
  vSimsCare->nCap = iVar6;
  uVar8 = 0;
  if (iVar6 == 0) {
    __s_00 = (word *)0x0;
  }
  else {
    __s_00 = (word *)malloc((long)iVar6 << 3);
  }
  vSimsCare->pArray = __s_00;
  vSimsCare->nSize = iVar9;
  memset(__s_00,0,(long)iVar9 << 3);
  uVar11 = 0;
  iVar6 = nUnDecs + nCexes;
  if (iVar6 != 0 && SCARRY4(nUnDecs,nCexes) == iVar6 < 0) {
    uVar11 = 0;
    uVar8 = 0;
    iVar9 = iVar6;
    do {
      if ((((int)uVar11 < 0) || (uVar2 = vCexStore->nSize, (int)uVar2 <= (int)uVar11)) ||
         (uVar1 = uVar11 + 1, uVar2 <= uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar11 = uVar11 + 2;
      nLits = vCexStore->pArray[uVar1];
      if (nLits != -1) {
        if (uVar2 <= uVar11) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        iVar3 = Gia_ManSimBitPackOne
                          (nWords,vSimsIn,vSimsCare,uVar8,vCexStore->pArray + uVar11,nLits);
        uVar8 = iVar3 + uVar8;
        if (iVar6 < (int)uVar8) {
          __assert_fail("iPat <= nCexes + nUnDecs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                        ,0xef,"Vec_Wrd_t *Gia_ManSimBitPacking(Gia_Man_t *, Vec_Int_t *, int, int)")
          ;
        }
        uVar11 = nLits + uVar11;
      }
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  if (uVar11 != vCexStore->nSize) {
    __assert_fail("iCur == Vec_IntSize(vCexStore)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0xf2,"Vec_Wrd_t *Gia_ManSimBitPacking(Gia_Man_t *, Vec_Int_t *, int, int)");
  }
  uVar11 = (((int)(uVar8 + 1) >> 6) + 1) - (uint)((uVar8 + 1 & 0x3f) == 0);
  pVVar5 = Gia_ManSimCombine(p->vCis->nSize,p->vSimsPi,vSimsIn,uVar11);
  printf("Compressed %d CEXes into %d patterns and added %d words to available %d words.\n",
         (ulong)(uint)nCexes,(ulong)uVar8,(ulong)uVar11,
         (long)p->vSimsPi->nSize / (long)p->vCis->nSize & 0xffffffff);
  if (__s != (word *)0x0) {
    free(__s);
  }
  free(vSimsIn);
  if (__s_00 != (word *)0x0) {
    free(__s_00);
  }
  free(vSimsCare);
  return pVVar5;
}

Assistant:

Vec_Wrd_t * Gia_ManSimBitPacking( Gia_Man_t * p, Vec_Int_t * vCexStore, int nCexes, int nUnDecs )
{
    int c, iCur = 0, iPat = 0;
    int nWordsMax = Abc_Bit6WordNum( nCexes ); 
    Vec_Wrd_t * vSimsIn   = Vec_WrdStartRandom( Gia_ManCiNum(p) * nWordsMax );
    Vec_Wrd_t * vSimsCare = Vec_WrdStart( Gia_ManCiNum(p) * nWordsMax );
    Vec_Wrd_t * vSimsRes  = NULL;
    for ( c = 0; c < nCexes + nUnDecs; c++ )
    {
        int Out  = Vec_IntEntry( vCexStore, iCur++ );
        int Size = Vec_IntEntry( vCexStore, iCur++ );
        if ( Size == -1 )
            continue;
        iPat += Gia_ManSimBitPackOne( nWordsMax, vSimsIn, vSimsCare, iPat, Vec_IntEntryP(vCexStore, iCur), Size );
        iCur += Size;
        assert( iPat <= nCexes + nUnDecs );
        Out = 0;
    }
    assert( iCur == Vec_IntSize(vCexStore) );
    vSimsRes = Gia_ManSimCombine( Gia_ManCiNum(p), p->vSimsPi, vSimsIn, Abc_Bit6WordNum(iPat+1) );
    printf( "Compressed %d CEXes into %d patterns and added %d words to available %d words.\n", 
        nCexes, iPat, Abc_Bit6WordNum(iPat+1), Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p) );
    Vec_WrdFree( vSimsIn );
    Vec_WrdFree( vSimsCare );
    return vSimsRes;
}